

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O1

char fl_make_path(char *path)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  size_t __n;
  
  iVar1 = access(path,0);
  cVar3 = '\x01';
  if (iVar1 != 0) {
    pcVar2 = strrchr(path,0x2f);
    if (pcVar2 == (char *)0x0) {
      cVar3 = '\0';
    }
    else {
      __n = (long)pcVar2 - (long)path;
      pcVar2 = (char *)malloc(__n + 1);
      memcpy(pcVar2,path,__n);
      pcVar2[__n] = '\0';
      fl_make_path(pcVar2);
      free(pcVar2);
      mkdir(path,0x1c0);
    }
  }
  return cVar3;
}

Assistant:

char fl_make_path( const char *path ) {
  if (fl_access(path, 0)) {
    const char *s = strrchr( path, '/' );
    if ( !s ) return 0;
    size_t len = (size_t) (s-path);
    char *p = (char*)malloc( len+1 );
    memcpy( p, path, len );
    p[len] = 0;
    fl_make_path( p );
    free( p );
    fl_mkdir(path, 0700);
  }
  return 1;
}